

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

char * __thiscall
icu_63::CollationLocaleListEnumeration::next
          (CollationLocaleListEnumeration *this,int32_t *resultLength,UErrorCode *param_2)

{
  int iVar1;
  Locale *pLVar2;
  int32_t iVar3;
  char *__s;
  size_t sVar4;
  
  pLVar2 = ::availableLocaleList;
  iVar1 = *(int *)&(this->super_StringEnumeration).field_0x74;
  if (iVar1 < ::availableLocaleListCount) {
    *(int *)&(this->super_StringEnumeration).field_0x74 = iVar1 + 1;
    __s = pLVar2[iVar1].fullName;
    if (resultLength == (int32_t *)0x0) {
      return __s;
    }
    sVar4 = strlen(__s);
    iVar3 = (int32_t)sVar4;
  }
  else {
    iVar3 = 0;
    __s = (char *)0x0;
    if (resultLength == (int32_t *)0x0) {
      return (char *)0x0;
    }
  }
  *resultLength = iVar3;
  return __s;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& /*status*/) {
        const char* result;
        if(index < availableLocaleListCount) {
            result = availableLocaleList[index++].getName();
            if(resultLength != NULL) {
                *resultLength = (int32_t)uprv_strlen(result);
            }
        } else {
            if(resultLength != NULL) {
                *resultLength = 0;
            }
            result = NULL;
        }
        return result;
    }